

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int exhaustive_parse(Parser *p,int state)

{
  char *pcVar1;
  PNode *pPVar2;
  Reduction *r_00;
  uint32 uVar3;
  int iVar4;
  SNode *pSVar5;
  ZNode *z_00;
  bool bVar6;
  undefined1 local_150 [8];
  d_loc_t loc;
  int ready;
  int progress;
  ZNode *z;
  SNode *sn;
  PNode tpn;
  PNode *pn;
  char *epos;
  char *pos;
  Reduction *r;
  int state_local;
  Parser *p_local;
  
  pn = (PNode *)0x0;
  loc.line = 0;
  loc.col = 0;
  pcVar1 = p->start;
  (p->user).loc.s = pcVar1;
  (p->user).loc.ws = pcVar1;
  local_150 = (undefined1  [8])(p->user).loc.s;
  loc.s = (p->user).loc.pathname;
  loc.pathname = (p->user).loc.ws;
  loc.ws = *(char **)&(p->user).loc.col;
  (*(p->user).initial_white_space_fn)(&p->user,(d_loc_t *)local_150,(void **)p);
  pSVar5 = add_SNode(p,p->t->state + state,(d_loc_t *)local_150,p->top_scope);
  memset(&sn,0,0xd8);
  tpn.ws_after = (char *)p->top_scope;
  tpn.parse_node.start_loc.col = local_150._0_4_;
  tpn.parse_node.start_loc.line = local_150._4_4_;
  tpn.parse_node.end_skip = tpn.ws_after;
  if ((pSVar5->last_pn != (PNode *)0x0) &&
     (uVar3 = pSVar5->last_pn->refcount - 1, pSVar5->last_pn->refcount = uVar3, uVar3 == 0)) {
    free_PNode(p,pSVar5->last_pn);
  }
  tpn.parse_node.user =
       add_PNode(p,0,(d_loc_t *)local_150,(char *)local_150,(PNode *)&sn,(D_Reduction *)0x0,
                 (VecZNode *)0x0,(D_Shift *)0x0);
  ((PNode *)tpn.parse_node.user)->refcount = ((PNode *)tpn.parse_node.user)->refcount + 1;
  pSVar5->last_pn = (PNode *)tpn.parse_node.user;
  z_00 = new_ZNode(p,(PNode *)tpn.parse_node.user);
  set_add_znode(&pSVar5->zns,z_00);
  while( true ) {
    while( true ) {
      while ((p->reductions_todo != (Reduction *)0x0 &&
             ((pPVar2 = (PNode *)(p->reductions_todo->snode->loc).s, p->shifts_todo == (Shift *)0x0
              || (pPVar2 <= (PNode *)(p->shifts_todo->snode->loc).s))))) {
        if (pn < pPVar2) {
          free_old_nodes(p);
          pn = pPVar2;
        }
        while( true ) {
          r_00 = p->reductions_todo;
          bVar6 = false;
          if (r_00 != (Reduction *)0x0) {
            bVar6 = (PNode *)(r_00->snode->loc).s == pPVar2;
          }
          if (!bVar6) break;
          p->reductions_todo = p->reductions_todo->next;
          reduce_one(p,r_00);
        }
      }
      if (p->shifts_todo == (Shift *)0x0) break;
      if (((p->user).dont_compare_stacks == 0) && (p->shifts_todo->next != (Shift *)0x0)) {
        cmp_stacks(p);
      }
      pPVar2 = (PNode *)(p->shifts_todo->snode->loc).s;
      if (pn < pPVar2) {
        free_old_nodes(p);
        pn = pPVar2;
      }
      loc.line = loc.line + 1;
      loc.col = (int)((p->user).commit_actions_interval < loc.line);
      if (((loc.col != 0) && (p->shifts_todo->next == (Shift *)0x0)) &&
         (p->reductions_todo == (Reduction *)0x0)) {
        iVar4 = commit_stack(p,p->shifts_todo->snode);
        if (iVar4 == -4) {
          return -1;
        }
        loc.line = 0;
        loc.col = 0;
      }
      shift_all(p,(char *)pPVar2);
      if (((loc.col != 0) && (p->reductions_todo != (Reduction *)0x0)) &&
         (p->reductions_todo->next == (Reduction *)0x0)) {
        iVar4 = commit_stack(p,p->reductions_todo->snode);
        if (iVar4 == -4) {
          return -1;
        }
        loc.line = 0;
      }
    }
    if ((p->accept != (SNode *)0x0) &&
       (((p->accept->loc).s == p->end || ((p->user).partial_parses != 0)))) break;
    iVar4 = error_recovery(p);
    if (iVar4 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int exhaustive_parse(Parser *p, int state) {
  Reduction *r;
  char *pos, *epos = NULL;
  PNode *pn, tpn;
  SNode *sn;
  ZNode *z;
  int progress = 0, ready = 0;
  d_loc_t loc;

  pos = p->user.loc.ws = p->user.loc.s = p->start;
  loc = p->user.loc;
  p->user.initial_white_space_fn((D_Parser *)p, &loc, &p->user.initial_globals);
  /* initial state */
  sn = add_SNode(p, &p->t->state[state], &loc, p->top_scope);
  memset(&tpn, 0, sizeof(tpn));
  tpn.initial_scope = tpn.parse_node.scope = p->top_scope;
  tpn.parse_node.end = loc.s;
  if (sn->last_pn) unref_pn(p, sn->last_pn);
  pn = add_PNode(p, 0, &loc, loc.s, &tpn, 0, 0, 0);
  ref_pn(pn);
  sn->last_pn = pn;
  set_add_znode(&sn->zns, (z = new_ZNode(p, pn)));
  while (1) {
    /* reduce all */
    while (p->reductions_todo) {
      pos = p->reductions_todo->snode->loc.s;
      if (p->shifts_todo && p->shifts_todo->snode->loc.s < pos) break;
      if (pos > epos) {
        epos = pos;
        free_old_nodes(p);
      }
      for (; (r = p->reductions_todo) && r->snode->loc.s == pos;) {
        p->reductions_todo = p->reductions_todo->next;
        reduce_one(p, r);
      }
    }
    /* done? */
    if (!p->shifts_todo) {
      if (p->accept && (p->accept->loc.s == p->end || p->user.partial_parses))
        return 0;
      else {
        if (error_recovery(p)) return 1;
        continue;
      }
    } else if (!p->user.dont_compare_stacks && p->shifts_todo->next)
      cmp_stacks(p);
    /* shift all */
    pos = p->shifts_todo->snode->loc.s;
    if (pos > epos) {
      epos = pos;
      free_old_nodes(p);
    }
    progress++;
    ready = progress > p->user.commit_actions_interval;
    if (ready && !p->shifts_todo->next && !p->reductions_todo) {
      if (commit_stack(p, p->shifts_todo->snode) == -4)
        return -1;
      ready = progress = 0;
    }
    shift_all(p, pos);
    if (ready && p->reductions_todo && !p->reductions_todo->next) {
      if (commit_stack(p, p->reductions_todo->snode) == -4)
        return -1;
      progress = 0;
    }
  }
}